

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

iterator __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
::makeIterator(DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
               *this,DenseMapPair<llbuild::core::KeyID,_DBKeyID> *P,
              DenseMapPair<llbuild::core::KeyID,_DBKeyID> *E,DebugEpochBase *Epoch,bool NoAdvance)

{
  bool bVar1;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *pDVar2;
  pointer local_60;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *B;
  bool NoAdvance_local;
  DebugEpochBase *Epoch_local;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *E_local;
  DenseMapPair<llbuild::core::KeyID,_DBKeyID> *P_local;
  DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
  *this_local;
  
  bVar1 = shouldReverseIterate<llbuild::core::KeyID>();
  if (bVar1) {
    pDVar2 = getBucketsEnd(this);
    if (P == pDVar2) {
      local_60 = getBuckets(this);
    }
    else {
      local_60 = P + 1;
    }
    DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
    ::DenseMapIterator((DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
                        *)&this_local,local_60,E,Epoch,NoAdvance);
  }
  else {
    DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
    ::DenseMapIterator((DenseMapIterator<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>,_false>
                        *)&this_local,P,E,Epoch,NoAdvance);
  }
  return _this_local;
}

Assistant:

iterator makeIterator(BucketT *P, BucketT *E,
                        DebugEpochBase &Epoch,
                        bool NoAdvance=false) {
    if (shouldReverseIterate<KeyT>()) {
      BucketT *B = P == getBucketsEnd() ? getBuckets() : P + 1;
      return iterator(B, E, Epoch, NoAdvance);
    }
    return iterator(P, E, Epoch, NoAdvance);
  }